

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluDrawUtil.cpp
# Opt level: O1

void glu::anon_unknown_4::setVertexAttribPointer(Functions *gl,VertexAttributeDescriptor *va)

{
  VertexComponentType VVar1;
  GLenum GVar2;
  
  VVar1 = va->componentType;
  GVar2 = 0;
  if ((ulong)VVar1 < 9) {
    GVar2 = *(GLenum *)(&DAT_00b8bc30 + (ulong)VVar1 * 4);
  }
  (*gl->enableVertexAttribArray)(va->location);
  if (va->convert == VTX_COMP_CONVERT_NONE && VVar1 < VTX_COMP_FIXED) {
    (*gl->vertexAttribIPointer)(va->location,va->numComponents,GVar2,va->stride,va->pointer);
    return;
  }
  (*gl->vertexAttribPointer)
            (va->location,va->numComponents,GVar2,va->convert == VTX_COMP_CONVERT_NORMALIZE_TO_FLOAT
             ,va->stride,va->pointer);
  return;
}

Assistant:

static void setVertexAttribPointer (const glw::Functions& gl, const VertexAttributeDescriptor& va)
{
	const bool		isIntType		= de::inRange<int>(va.componentType, VTX_COMP_UNSIGNED_INT8, VTX_COMP_SIGNED_INT32);
	const bool		isSpecialType	= de::inRange<int>(va.componentType, VTX_COMP_FIXED, VTX_COMP_FLOAT);
	const deUint32	compTypeGL		= getVtxCompGLType(va.componentType);

	DE_ASSERT(isIntType != isSpecialType); // Must be either int or special type.
	DE_ASSERT(isIntType || va.convert == VTX_COMP_CONVERT_NONE); // Conversion allowed only for special types.
	DE_UNREF(isSpecialType);

	gl.enableVertexAttribArray(va.location);

	if (isIntType && va.convert == VTX_COMP_CONVERT_NONE)
		gl.vertexAttribIPointer(va.location, va.numComponents, compTypeGL, va.stride, va.pointer);
	else
		gl.vertexAttribPointer(va.location, va.numComponents, compTypeGL, va.convert == VTX_COMP_CONVERT_NORMALIZE_TO_FLOAT ? GL_TRUE : GL_FALSE, va.stride, va.pointer);
}